

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O2

bool QMetaType::registerConverterFunction(ConverterFunction *f,QMetaType from,QMetaType to)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Type *this;
  char *pcVar4;
  char *pcVar5;
  pair<int,_int> k;
  long in_FS_OFFSET;
  QMessageLogger local_60;
  QMetaType local_40;
  QMetaType local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.d_ptr = to.d_ptr;
  local_38.d_ptr = from.d_ptr;
  this = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypesConversionRegistry>_>
         ::operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypesConversionRegistry>_>
                       *)f);
  iVar2 = registerHelper(&local_38);
  iVar3 = registerHelper(&local_40);
  k.second = iVar3;
  k.first = iVar2;
  bVar1 = QMetaTypeFunctionRegistry<std::function<bool_(const_void_*,_void_*)>,_std::pair<int,_int>_>
          ::insertIfNotContains(this,k,f);
  if (!bVar1) {
    local_60.context.version = 2;
    local_60.context._4_8_ = 0;
    local_60.context._12_8_ = 0;
    local_60.context.function._4_4_ = 0;
    local_60.context.category = "default";
    if (local_38.d_ptr == (QMetaTypeInterface *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar5 = (local_38.d_ptr)->name;
    }
    if (local_40.d_ptr == (QMetaTypeInterface *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar4 = (local_40.d_ptr)->name;
    }
    QMessageLogger::warning
              (&local_60,"Type conversion already registered from type %s to type %s",pcVar5,pcVar4)
    ;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QMetaType::registerConverterFunction(const ConverterFunction &f, QMetaType from, QMetaType to)
{
    if (!customTypesConversionRegistry()->insertIfNotContains({from.id(), to.id()}, f)) {
        qWarning("Type conversion already registered from type %s to type %s",
                 from.name(), to.name());
        return false;
    }
    return true;
}